

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::ZmpTrackingGainEstimator::setGain
          (ZmpTrackingGainEstimator *this,Vector3 *gain,Vector3 *uncertainty)

{
  Matrix5 P;
  Matrix3 local_160;
  Type local_118;
  PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>> local_e8 [200];
  
  setGain(this,gain);
  KalmanFilterBase::getStateCovariance
            ((Pmatrix *)&local_160,&(this->filter_).super_KalmanFilterBase);
  Eigen::PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_160);
  free((void *)local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0]);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::topRightCorner<2,3>
            ((Type *)&local_160,(DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_e8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2,_3,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_2,_3,_false>_> *)
             &local_160);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::bottomLeftCorner<3,2>
            ((Type *)&local_160,(DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_e8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_3,_2,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_3,_2,_false>_> *)
             &local_160);
  Vec3ToSqDiag_(&local_160,uncertainty);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::bottomRightCorner<3,3>
            (&local_118,(DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_e8);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,5,5,0,5,5>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_118,&local_160);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_160,
             (DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_e8);
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_160);
  free((void *)local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0]);
  return;
}

Assistant:

void ZmpTrackingGainEstimator::setGain(const Vector3 & gain, const Vector3 & uncertainty)
{
  setGain(gain);
  Matrix5 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 3>().setZero();
  P.bottomLeftCorner<3, 2>().setZero();
  /// updating the gain part
  P.bottomRightCorner<3, 3>() = Vec3ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}